

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Obj_t * Abc_NodeFindNonCoFanout(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(pNode->vFanouts).nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar3]];
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        return pAVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NodeFindNonCoFanout( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pNode, pFanout, i )
        if ( !Abc_ObjIsCo(pFanout) )
            return pFanout;
    return NULL;
}